

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

path * __thiscall
boost::filesystem::path::lexically_relative(path *__return_storage_ptr__,path *this,path *base)

{
  type tVar1;
  path *ppVar2;
  reference p;
  type local_2c2;
  type local_2a2;
  iterator local_280;
  iterator local_250;
  undefined1 local_21a;
  byte local_219;
  iterator local_218;
  iterator local_1e8;
  undefined4 local_1b8;
  byte local_1b1;
  iterator local_1b0;
  iterator local_180;
  iterator local_150;
  iterator local_120;
  iterator local_e0;
  iterator local_b0;
  undefined1 local_80 [8];
  pair<boost::filesystem::path::iterator,_boost::filesystem::path::iterator> mm;
  path *base_local;
  path *this_local;
  path *tmp;
  
  mm.second.m_pos = (size_type)base;
  begin(&local_b0,this);
  end(&local_e0,this);
  begin(&local_120,(path *)mm.second.m_pos);
  end(&local_150,(path *)mm.second.m_pos);
  detail::mismatch((pair<boost::filesystem::path::iterator,_boost::filesystem::path::iterator> *)
                   local_80,&local_b0,&local_e0,&local_120,&local_150);
  iterator::~iterator(&local_150);
  iterator::~iterator(&local_120);
  iterator::~iterator(&local_e0);
  iterator::~iterator(&local_b0);
  local_1b1 = 0;
  begin(&local_180,this);
  tVar1 = iterators::operator==
                    ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                      *)local_80,
                     (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                      *)&local_180);
  local_2a2 = false;
  if (tVar1) {
    begin(&local_1b0,(path *)mm.second.m_pos);
    local_1b1 = 1;
    local_2a2 = iterators::operator==
                          ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                            *)&mm.first.m_pos,
                           (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                            *)&local_1b0);
  }
  if ((local_1b1 & 1) != 0) {
    iterator::~iterator(&local_1b0);
  }
  iterator::~iterator(&local_180);
  if (local_2a2 == false) {
    local_219 = 0;
    end(&local_1e8,this);
    tVar1 = iterators::operator==
                      ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                        *)local_80,
                       (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                        *)&local_1e8);
    local_2c2 = false;
    if (tVar1) {
      end(&local_218,(path *)mm.second.m_pos);
      local_219 = 1;
      local_2c2 = iterators::operator==
                            ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                              *)&mm.first.m_pos,
                             (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                              *)&local_218);
    }
    if ((local_219 & 1) != 0) {
      iterator::~iterator(&local_218);
    }
    iterator::~iterator(&local_1e8);
    if (local_2c2 == false) {
      local_21a = 0;
      path(__return_storage_ptr__);
      while( true ) {
        end(&local_250,(path *)mm.second.m_pos);
        tVar1 = iterators::operator!=
                          ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                            *)&mm.first.m_pos,
                           (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                            *)&local_250);
        iterator::~iterator(&local_250);
        if (!tVar1) break;
        ppVar2 = detail::dot_dot_path();
        operator/=(__return_storage_ptr__,ppVar2);
        iterators::detail::
        iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
        ::operator++((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                      *)&mm.first.m_pos);
      }
      while( true ) {
        end(&local_280,this);
        tVar1 = iterators::operator!=
                          ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                            *)local_80,
                           (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                            *)&local_280);
        iterator::~iterator(&local_280);
        if (!tVar1) break;
        p = iterators::detail::
            iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
            ::operator*((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                         *)local_80);
        operator/=(__return_storage_ptr__,p);
        iterators::detail::
        iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
        ::operator++((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                      *)local_80);
      }
      local_21a = 1;
    }
    else {
      ppVar2 = detail::dot_path();
      path(__return_storage_ptr__,ppVar2);
    }
  }
  else {
    path(__return_storage_ptr__);
  }
  local_1b8 = 1;
  std::pair<boost::filesystem::path::iterator,_boost::filesystem::path::iterator>::~pair
            ((pair<boost::filesystem::path::iterator,_boost::filesystem::path::iterator> *)local_80)
  ;
  return __return_storage_ptr__;
}

Assistant:

path path::lexically_relative(const path& base) const
  {
    std::pair<path::iterator, path::iterator> mm
      = detail::mismatch(begin(), end(), base.begin(), base.end());
    if (mm.first == begin() && mm.second == base.begin())
      return path();
    if (mm.first == end() && mm.second == base.end())
      return detail::dot_path();
    path tmp;
    for (; mm.second != base.end(); ++mm.second)
      tmp /= detail::dot_dot_path();
    for (; mm.first != end(); ++mm.first)
      tmp /= *mm.first;
    return tmp;
  }